

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtreewidget.cpp
# Opt level: O1

void QTreeWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  undefined4 *puVar2;
  undefined4 uVar3;
  long lVar4;
  void **ppvVar5;
  ScrollHint hint;
  int iVar6;
  QTreeWidgetItem *item;
  long in_FS_OFFSET;
  undefined8 local_50;
  void *local_48;
  undefined8 *puStack_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c);
  switch(_id) {
  case 0:
    itemPressed((QTreeWidget *)_o,*_a[1],*_a[2]);
    break;
  case 1:
    itemClicked((QTreeWidget *)_o,*_a[1],*_a[2]);
    break;
  case 2:
    itemDoubleClicked((QTreeWidget *)_o,*_a[1],*_a[2]);
    break;
  case 3:
    itemActivated((QTreeWidget *)_o,*_a[1],*_a[2]);
    break;
  case 4:
    itemEntered((QTreeWidget *)_o,*_a[1],*_a[2]);
    break;
  case 5:
    itemChanged((QTreeWidget *)_o,*_a[1],*_a[2]);
    break;
  case 6:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar5 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 6;
    goto LAB_005c2045;
  case 7:
    local_50 = *_a[1];
    puStack_40 = &local_50;
    ppvVar5 = &local_48;
    local_48 = (void *)0x0;
    iVar6 = 7;
    goto LAB_005c2045;
  case 8:
    currentItemChanged((QTreeWidget *)_o,*_a[1],*_a[2]);
    break;
  case 9:
    iVar6 = 9;
    ppvVar5 = (void **)0x0;
LAB_005c2045:
    QMetaObject::activate(_o,&staticMetaObject,iVar6,ppvVar5);
    break;
  case 10:
    item = *_a[1];
    hint = *_a[2];
    goto LAB_005c205c;
  case 0xb:
    item = *_a[1];
    hint = EnsureVisible;
LAB_005c205c:
    scrollToItem((QTreeWidget *)_o,item,hint);
    break;
  case 0xc:
    expandItem((QTreeWidget *)_o,*_a[1]);
    break;
  case 0xd:
    collapseItem((QTreeWidget *)_o,*_a[1]);
    break;
  case 0xe:
    clear((QTreeWidget *)_o);
  }
  if (_c == ReadProperty) {
switchD_005c1ec2_caseD_1:
    puVar2 = (undefined4 *)*_a;
    if (_id == 1) {
      lVar4 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
      uVar3 = *(undefined4 *)(*(long *)(lVar4 + 0x10) + 0x50);
LAB_005c2247:
      *puVar2 = uVar3;
    }
    else if (_id == 0) {
      local_48 = (void *)0xffffffffffffffff;
      puStack_40 = (undefined8 *)0x0;
      uStack_38 = 0;
      uVar3 = (**(code **)(**(long **)(*(long *)(_o + 8) + 0x2f8) + 0x80))();
      goto LAB_005c2247;
    }
    if (_c != WriteProperty || _id != 0) goto switchD_005c1ec2_caseD_3;
  }
  else {
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_005c1ec2_caseD_3;
      plVar1 = (long *)_a[1];
      if (((code *)*plVar1 == itemPressed) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 0;
        goto switchD_005c1ec2_caseD_3;
      }
      if (((code *)*plVar1 == itemClicked) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 1;
        goto switchD_005c1ec2_caseD_3;
      }
      if (((code *)*plVar1 == itemDoubleClicked) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 2;
        goto switchD_005c1ec2_caseD_3;
      }
      if (((code *)*plVar1 == itemActivated) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 3;
        goto switchD_005c1ec2_caseD_3;
      }
      if (((code *)*plVar1 == itemEntered) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 4;
        goto switchD_005c1ec2_caseD_3;
      }
      if (((code *)*plVar1 == itemChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 5;
        goto switchD_005c1ec2_caseD_3;
      }
      if (((code *)*plVar1 == itemExpanded) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 6;
        goto switchD_005c1ec2_caseD_3;
      }
      if (((code *)*plVar1 == itemCollapsed) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 7;
        goto switchD_005c1ec2_caseD_3;
      }
      if (((code *)*plVar1 == currentItemChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 8;
        goto switchD_005c1ec2_caseD_3;
      }
      if (((code *)*plVar1 == itemSelectionChanged) && (plVar1[1] == 0)) {
        *(undefined4 *)*_a = 9;
        goto switchD_005c1ec2_caseD_3;
      }
      if (_c != WriteProperty) {
        if (_c != ReadProperty) goto switchD_005c1ec2_caseD_3;
        goto switchD_005c1ec2_caseD_1;
      }
    }
    if (_id != 0) goto switchD_005c1ec2_caseD_3;
  }
  setColumnCount((QTreeWidget *)_o,**_a);
switchD_005c1ec2_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTreeWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 6: _t->itemExpanded((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1]))); break;
        case 7: _t->itemCollapsed((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1]))); break;
        case 8: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTreeWidgetItem*>>(_a[2]))); break;
        case 9: _t->itemSelectionChanged(); break;
        case 10: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 11: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 12: _t->expandItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 13: _t->collapseItem((*reinterpret_cast< std::add_pointer_t<const QTreeWidgetItem*>>(_a[1]))); break;
        case 14: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , int )>(_a, &QTreeWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * )>(_a, &QTreeWidget::itemExpanded, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * )>(_a, &QTreeWidget::itemCollapsed, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)(QTreeWidgetItem * , QTreeWidgetItem * )>(_a, &QTreeWidget::currentItemChanged, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeWidget::*)()>(_a, &QTreeWidget::itemSelectionChanged, 9))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->columnCount(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->topLevelItemCount(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setColumnCount(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}